

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.cpp
# Opt level: O1

void __thiscall
GrpcLikeMessageBuilder::GrpcLikeMessageBuilder
          (GrpcLikeMessageBuilder *this,GrpcLikeMessageBuilder *other)

{
  bool bVar1;
  Allocator *pAVar2;
  
  (this->super_AllocatorMember).member_allocator_.super_Allocator._vptr_Allocator =
       (_func_int **)&PTR__Allocator_00200ce8;
  (this->super_FlatBufferBuilder).buf_.allocator_ = (Allocator *)this;
  (this->super_FlatBufferBuilder).buf_.own_allocator_ = false;
  (this->super_FlatBufferBuilder).buf_.initial_size_ = 0x400;
  (this->super_FlatBufferBuilder).buf_.max_size_ = 0x7fffffff;
  (this->super_FlatBufferBuilder).buf_.buffer_minalign_ = 8;
  (this->super_FlatBufferBuilder).buf_.reserved_ = 0;
  (this->super_FlatBufferBuilder).buf_.size_ = 0;
  (this->super_FlatBufferBuilder).length_of_64_bit_region_ = 0;
  (this->super_FlatBufferBuilder).nested = false;
  (this->super_FlatBufferBuilder).finished = false;
  (this->super_FlatBufferBuilder).buf_.buf_ = (uint8_t *)0x0;
  (this->super_FlatBufferBuilder).buf_.cur_ = (uint8_t *)0x0;
  *(undefined8 *)((long)&(this->super_FlatBufferBuilder).buf_.cur_ + 6) = 0;
  *(undefined8 *)((long)&(this->super_FlatBufferBuilder).buf_.scratch_ + 6) = 0;
  (this->super_FlatBufferBuilder).minalign_ = 1;
  (this->super_FlatBufferBuilder).force_defaults_ = false;
  (this->super_FlatBufferBuilder).dedup_vtables_ = true;
  (this->super_FlatBufferBuilder).string_pool = (StringOffsetMap *)0x0;
  flatbuffers::FlatBufferBuilderImpl<false>::Swap
            (&this->super_FlatBufferBuilder,&other->super_FlatBufferBuilder);
  pAVar2 = (this->super_FlatBufferBuilder).buf_.allocator_;
  (this->super_FlatBufferBuilder).buf_.allocator_ = (other->super_FlatBufferBuilder).buf_.allocator_
  ;
  (other->super_FlatBufferBuilder).buf_.allocator_ = pAVar2;
  bVar1 = (this->super_FlatBufferBuilder).buf_.own_allocator_;
  (this->super_FlatBufferBuilder).buf_.own_allocator_ =
       (other->super_FlatBufferBuilder).buf_.own_allocator_;
  (other->super_FlatBufferBuilder).buf_.own_allocator_ = bVar1;
  return;
}

Assistant:

GrpcLikeMessageBuilder(GrpcLikeMessageBuilder &&other)
      : FlatBufferBuilder(1024, &member_allocator_, false) {
    // Default construct and swap idiom.
    Swap(other);
  }